

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O1

void __thiscall DPlayerMenu::UpdateColorsets(DPlayerMenu *this)

{
  int *piVar1;
  uint uVar2;
  PClassPlayerPawn *pPVar3;
  Node *pNVar4;
  undefined8 *puVar5;
  FListMenuItem *pFVar6;
  ulong uVar7;
  Node *pNVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  FName local_2c;
  
  local_2c.Index = 0x1e6;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_2c);
  if (pFVar6 != (FListMenuItem *)0x0) {
    PClassPlayerPawn::EnumColorSets(this->PlayerClass->Type,&this->PlayerColorSets);
    (*pFVar6->_vptr_FListMenuItem[8])(pFVar6,0,"Custom");
    uVar2 = (this->PlayerColorSets).Count;
    uVar7 = (ulong)uVar2;
    if (uVar2 != 0) {
      uVar11 = 0;
      do {
        pPVar3 = this->PlayerClass->Type;
        uVar2 = (this->PlayerColorSets).Array[uVar11];
        pNVar4 = (pPVar3->ColorSets).Nodes + ((pPVar3->ColorSets).Size - 1 & uVar2);
        do {
          pNVar8 = pNVar4;
          pNVar4 = pNVar8->Next;
        } while ((pNVar8->Pair).Key != uVar2);
        uVar11 = uVar11 + 1;
        (*pFVar6->_vptr_FListMenuItem[8])
                  (pFVar6,uVar11 & 0xffffffff,
                   FName::NameData.NameArray[(pNVar8->Pair).Value.Name.Index].Text);
        uVar7 = (ulong)(this->PlayerColorSets).Count;
      } while (uVar11 < uVar7);
    }
    puVar5 = (undefined8 *)
             ((ulong)(((&DAT_00a392d8)[(long)consoleplayer * 0xa8] - 1 & 0x219) * 0x18) +
             (&DAT_00a392c8)[(long)consoleplayer * 0x54]);
    do {
      puVar9 = puVar5;
      puVar5 = (undefined8 *)*puVar9;
    } while (*(int *)(puVar9 + 1) != 0x219);
    uVar11 = 0;
    if ((int)uVar7 != 0 && *(int *)(puVar9[2] + 0x28) != -1) {
      uVar10 = 0;
      uVar11 = 0;
      do {
        piVar1 = (this->PlayerColorSets).Array + uVar10;
        uVar10 = uVar10 + 1;
        if (*piVar1 == *(int *)(puVar9[2] + 0x28)) {
          uVar11 = uVar10 & 0xffffffff;
        }
      } while (uVar7 != uVar10);
    }
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,uVar11);
  }
  return;
}

Assistant:

void DPlayerMenu::UpdateColorsets()
{
	FListMenuItem *li = GetItem(NAME_Color);
	if (li != NULL)
	{
		int sel = 0;
		PlayerClass->Type->EnumColorSets(&PlayerColorSets);
		li->SetString(0, "Custom");
		for(unsigned i=0;i<PlayerColorSets.Size(); i++)
		{
			FPlayerColorSet *colorset = PlayerClass->Type->GetColorSet(PlayerColorSets[i]);
			li->SetString(i+1, colorset->Name);
		}
		int mycolorset = players[consoleplayer].userinfo.GetColorSet();
		if (mycolorset != -1)
		{
			for(unsigned i=0;i<PlayerColorSets.Size(); i++)
			{
				if (PlayerColorSets[i] == mycolorset)
				{
					sel = i+1;
				}
			}
		}
		li->SetValue(0, sel);
	}
}